

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

Bool ShouldIndent(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  TidyTagId TVar2;
  Node *node_00;
  Dict *pDVar3;
  Bool BVar4;
  Bool BVar5;
  Node **ppNVar6;
  
  iVar1 = *(int *)((doc->config).value + 0x25);
  BVar4 = no;
  if ((iVar1 != 0) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TEXTAREA)))) {
    if (iVar1 == 2) {
      if ((node->content != (Node *)0x0) && (BVar4 = prvTidynodeHasCM(node,0x40000), BVar4 != no)) {
        ppNVar6 = &node->content;
        do {
          node_00 = *ppNVar6;
          if (node_00 == (Node *)0x0) {
            return no;
          }
          BVar4 = prvTidynodeHasCM(node_00,8);
          ppNVar6 = &node_00->next;
        } while (BVar4 == no);
        return yes;
      }
      BVar4 = prvTidynodeHasCM(node,0x4000);
      if (BVar4 != no) {
        return no;
      }
      if (node->tag != (Dict *)0x0) {
        TVar2 = node->tag->id;
        if (TVar2 == TidyTag_TITLE) {
          return no;
        }
        if (TVar2 == TidyTag_HTML) {
          return no;
        }
        if (TVar2 == TidyTag_P) {
          return no;
        }
        if ((((TVar2 == TidyTag_DIV) && (node->last != (Node *)0x0)) &&
            (pDVar3 = node->last->tag, pDVar3 != (Dict *)0x0)) && (pDVar3->id == TidyTag_IMG)) {
          return no;
        }
      }
    }
    BVar5 = prvTidynodeHasCM(node,0xc00);
    BVar4 = yes;
    if ((BVar5 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_MAP)))) {
      BVar5 = prvTidynodeHasCM(node,0x10);
      BVar4 = no;
      if (BVar5 == no) {
        BVar4 = (Bool)(node->content != (Node *)0x0);
      }
    }
  }
  return BVar4;
}

Assistant:

static Bool ShouldIndent( TidyDocImpl* doc, Node *node )
{
    TidyTriState indentContent = cfgAutoBool( doc, TidyIndentContent );
    if ( indentContent == TidyNoState )
        return no;

    if ( nodeIsTEXTAREA(node) )
        return no;

    if ( indentContent == TidyAutoState )
    {
        if ( node->content && TY_(nodeHasCM)(node, CM_NO_INDENT) )
        {
            for ( node = node->content; node; node = node->next )
                if ( TY_(nodeHasCM)(node, CM_BLOCK) )
                    return yes;
            return no;
        }

        if ( TY_(nodeHasCM)(node, CM_HEADING) )
            return no;

        if ( nodeIsHTML(node) )
            return no;

        if ( nodeIsP(node) )
            return no;

        if ( nodeIsTITLE(node) )
            return no;

        /* http://tidy.sf.net/issue/1610888
           Indenting <div><img /></div> produces spurious lines with IE 6.x */
        if ( nodeIsDIV(node) && node->last && nodeIsIMG(node->last) )
            return no;
    }

    if ( TY_(nodeHasCM)(node, CM_FIELD | CM_OBJECT) )
        return yes;

    if ( nodeIsMAP(node) )
        return yes;

    return ( !TY_(nodeHasCM)( node, CM_INLINE ) && node->content );
}